

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O1

ExprBase * EvaluateCast(ExpressionEvalContext *ctx,ExprTypeCast *expression)

{
  ExprPointerLiteral *pEVar1;
  ExpressionContext *pEVar2;
  Allocator *pAVar3;
  char *pcVar4;
  TypeBase *pTVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uchar *in_RAX;
  ExprMemoryLiteral *memory;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TypeRef *pTVar9;
  ExprMemoryLiteral *pEVar10;
  TypeBase *pTVar11;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  _func_int **pp_Var13;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  ExprMemoryLiteral *pEVar14;
  ExprBase *pEVar15;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  bool bVar16;
  TypeBase **ppTVar17;
  SynBase *pSVar18;
  undefined **ppuVar19;
  uchar *puVar20;
  ExprBase *unaff_R12;
  ExprTypeLiteral *typeLiteral;
  longlong result;
  uchar *local_38;
  ExprPointerLiteral *pEVar12;
  
  if (ctx->instructionsLimit <= ctx->instruction) {
    Report(ctx,"ERROR: instruction limit reached");
    return (ExprBase *)0x0;
  }
  ctx->instruction = ctx->instruction + 1;
  local_38 = in_RAX;
  memory = (ExprMemoryLiteral *)Evaluate(ctx,expression->value);
  if (memory == (ExprMemoryLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
  switch(expression->category) {
  case EXPR_CAST_NUMERICAL:
    bVar16 = ExpressionContext::IsIntegerType(ctx->ctx,(expression->super_ExprBase).type);
    if (!bVar16) {
      bVar16 = ExpressionContext::IsFloatingPointType(ctx->ctx,(expression->super_ExprBase).type);
      if (!bVar16) goto switchD_0014b667_default;
      local_38 = (uchar *)0x0;
      bVar6 = TryTakeDouble((ExprBase *)memory,(double *)&local_38);
      bVar16 = true;
      if (!bVar6) goto LAB_0014c0dc;
      pTVar11 = (expression->super_ExprBase).type;
      pEVar2 = ctx->ctx;
      if (pTVar11 == pEVar2->typeFloat) {
        iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
        pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_26,iVar7);
        ppTVar17 = &ctx->ctx->typeFloat;
        puVar20 = (uchar *)(double)(float)(double)local_38;
      }
      else {
        if (pTVar11 != pEVar2->typeDouble) goto LAB_0014c59e;
        iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
        pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_15,iVar7);
        ppTVar17 = &ctx->ctx->typeDouble;
        puVar20 = local_38;
      }
      pTVar11 = *ppTVar17;
      pSVar18 = (expression->super_ExprBase).source;
      (pEVar12->super_ExprBase).typeID = 7;
      (pEVar12->super_ExprBase).source = pSVar18;
      (pEVar12->super_ExprBase).type = pTVar11;
      (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar12->super_ExprBase).listed = false;
      (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248538;
      pEVar12->ptr = puVar20;
      goto LAB_0014c594;
    }
    local_38 = (uchar *)0x0;
    if ((memory != (ExprMemoryLiteral *)0x0) && ((memory->super_ExprBase).typeID == 7)) {
      pTVar11 = (expression->super_ExprBase).type;
      pEVar2 = ctx->ctx;
      if (pTVar11 == pEVar2->typeBool) {
        iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x30);
        pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_23,iVar7);
        pSVar18 = (expression->super_ExprBase).source;
        pEVar1 = memory->ptr;
        pTVar11 = ctx->ctx->typeBool;
        (pEVar12->super_ExprBase).typeID = 3;
        (pEVar12->super_ExprBase).source = pSVar18;
        (pEVar12->super_ExprBase).type = pTVar11;
        (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar12->super_ExprBase).listed = false;
        (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
        (pEVar12->super_ExprBase).field_0x29 = (double)pEVar1 != 0.0;
      }
      else if (pTVar11 == pEVar2->typeChar) {
        iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x30);
        pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_24,iVar7);
        pSVar18 = (expression->super_ExprBase).source;
        pTVar11 = ctx->ctx->typeChar;
        pEVar1 = memory->ptr;
        (pEVar12->super_ExprBase).typeID = 4;
        (pEVar12->super_ExprBase).source = pSVar18;
        (pEVar12->super_ExprBase).type = pTVar11;
        (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar12->super_ExprBase).listed = false;
        (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002484c8;
        (pEVar12->super_ExprBase).field_0x29 = (char)(int)(double)pEVar1;
      }
      else {
        if (pTVar11 == pEVar2->typeShort) {
          iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
          pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_28,iVar7);
          pSVar18 = (expression->super_ExprBase).source;
          pTVar11 = ctx->ctx->typeShort;
          puVar20 = (uchar *)(long)(short)(int)(double)memory->ptr;
        }
        else if (pTVar11 == pEVar2->typeInt) {
          iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
          pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_30,iVar7);
          pSVar18 = (expression->super_ExprBase).source;
          pTVar11 = ctx->ctx->typeInt;
          puVar20 = (uchar *)(long)(int)(double)memory->ptr;
        }
        else {
          if (pTVar11 != pEVar2->typeLong) goto LAB_0014c0dc;
          iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
          pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_32,iVar7);
          pSVar18 = (expression->super_ExprBase).source;
          pTVar11 = ctx->ctx->typeLong;
          puVar20 = (uchar *)(long)(double)memory->ptr;
        }
LAB_0014c565:
        (pEVar12->super_ExprBase).typeID = 6;
        (pEVar12->super_ExprBase).source = pSVar18;
        (pEVar12->super_ExprBase).type = pTVar11;
        (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar12->super_ExprBase).listed = false;
        (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
        pEVar12->ptr = puVar20;
      }
      goto LAB_0014c594;
    }
    bVar6 = TryTakeLong((ExprBase *)memory,(longlong *)&local_38);
    bVar16 = true;
    if (bVar6) {
      pTVar11 = (expression->super_ExprBase).type;
      pEVar2 = ctx->ctx;
      if (pTVar11 == pEVar2->typeBool) {
        iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x30);
        pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_25,iVar7);
        pSVar18 = (expression->super_ExprBase).source;
        pTVar11 = ctx->ctx->typeBool;
        (pEVar12->super_ExprBase).typeID = 3;
        (pEVar12->super_ExprBase).source = pSVar18;
        (pEVar12->super_ExprBase).type = pTVar11;
        (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar12->super_ExprBase).listed = false;
        (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
        (pEVar12->super_ExprBase).field_0x29 = local_38 != (uchar *)0x0;
      }
      else {
        if (pTVar11 != pEVar2->typeChar) {
          if (pTVar11 == pEVar2->typeShort) {
            iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
            pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_31,iVar7);
            pSVar18 = (expression->super_ExprBase).source;
            pTVar11 = ctx->ctx->typeShort;
            puVar20 = (uchar *)(long)(short)local_38;
          }
          else if (pTVar11 == pEVar2->typeInt) {
            iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
            pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_33,iVar7);
            pSVar18 = (expression->super_ExprBase).source;
            pTVar11 = ctx->ctx->typeInt;
            puVar20 = (uchar *)(long)(int)local_38;
          }
          else {
            if (pTVar11 != pEVar2->typeLong) goto LAB_0014c59e;
            iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
            pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_19,iVar7);
            pSVar18 = (expression->super_ExprBase).source;
            pTVar11 = ctx->ctx->typeLong;
            puVar20 = local_38;
          }
          goto LAB_0014c565;
        }
        iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x30);
        pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_29,iVar7);
        pSVar18 = (expression->super_ExprBase).source;
        pTVar11 = ctx->ctx->typeChar;
        (pEVar12->super_ExprBase).typeID = 4;
        (pEVar12->super_ExprBase).source = pSVar18;
        (pEVar12->super_ExprBase).type = pTVar11;
        (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
        (pEVar12->super_ExprBase).listed = false;
        (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002484c8;
        (pEVar12->super_ExprBase).field_0x29 = local_38._0_1_;
      }
      goto LAB_0014c594;
    }
LAB_0014c0dc:
    bVar16 = true;
    goto LAB_0014c59e;
  case EXPR_CAST_PTR_TO_BOOL:
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
    pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_07,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar11 = ctx->ctx->typeBool;
    bVar16 = (memory->super_ExprBase).typeID == 9;
    goto LAB_0014bae0;
  case EXPR_CAST_UNSIZED_TO_BOOL:
    if ((memory->super_ExprBase).typeID != 0xd) {
      memory = (ExprMemoryLiteral *)0x0;
    }
    pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    pEVar15 = CreateExtract(ctx,memory,0,&pTVar9->super_TypeBase);
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
    pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_02,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar11 = ctx->ctx->typeBool;
    if (pEVar15 == (ExprBase *)0x0) {
      bVar16 = true;
    }
    else {
      bVar16 = pEVar15->typeID != 9;
    }
    (pEVar14->super_ExprBase).typeID = 3;
    (pEVar14->super_ExprBase).source = pSVar18;
    (pEVar14->super_ExprBase).type = pTVar11;
    (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar14->super_ExprBase).listed = false;
    (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
    (pEVar14->super_ExprBase).field_0x29 = bVar16;
    goto LAB_0014c041;
  case EXPR_CAST_FUNCTION_TO_BOOL:
    pEVar10 = (ExprMemoryLiteral *)0x0;
    if ((memory->super_ExprBase).typeID == 0xb) {
      pEVar10 = memory;
    }
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
    pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_03,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar11 = ctx->ctx->typeBool;
    bVar16 = pEVar10->ptr == (ExprPointerLiteral *)0x0;
LAB_0014bae0:
    (pEVar14->super_ExprBase).typeID = 3;
    (pEVar14->super_ExprBase).source = pSVar18;
    (pEVar14->super_ExprBase).type = pTVar11;
    (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar14->super_ExprBase).listed = false;
    (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248490;
    (pEVar14->super_ExprBase).field_0x29 = !bVar16;
    goto LAB_0014c041;
  case EXPR_CAST_NULL_TO_PTR:
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
    pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar11 = (expression->super_ExprBase).type;
    (pEVar14->super_ExprBase).typeID = 9;
    (pEVar14->super_ExprBase).source = pSVar18;
    (pEVar14->super_ExprBase).type = pTVar11;
    (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar14->super_ExprBase).listed = false;
    (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
    goto LAB_0014c041;
  case EXPR_CAST_NULL_TO_AUTO_PTR:
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_08,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pEVar2 = ctx->ctx;
    pTVar11 = pEVar2->typeVoid;
    pTVar5 = pEVar2->typeTypeID;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar18;
    (memory->super_ExprBase).type = pTVar5;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
    memory->ptr = (ExprPointerLiteral *)pTVar11;
    iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x30);
    pEVar10 = (ExprMemoryLiteral *)CONCAT44(extraout_var_09,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (pEVar10->super_ExprBase).typeID = 9;
    (pEVar10->super_ExprBase).source = pSVar18;
    (pEVar10->super_ExprBase).type = &pTVar9->super_TypeBase;
    (pEVar10->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar10->super_ExprBase).listed = false;
    (pEVar10->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
    pTVar11 = (expression->super_ExprBase).type;
    break;
  case EXPR_CAST_NULL_TO_UNSIZED:
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_11,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (memory->super_ExprBase).typeID = 9;
    (memory->super_ExprBase).source = pSVar18;
    (memory->super_ExprBase).type = &pTVar9->super_TypeBase;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
    pEVar10 = (ExprMemoryLiteral *)CONCAT44(extraout_var_12,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar11 = ctx->ctx->typeInt;
    (pEVar10->super_ExprBase).typeID = 6;
    (pEVar10->super_ExprBase).source = pSVar18;
    (pEVar10->super_ExprBase).type = pTVar11;
    (pEVar10->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar10->super_ExprBase).listed = false;
    (pEVar10->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
    pEVar10->ptr = (ExprPointerLiteral *)0x0;
    pTVar11 = (expression->super_ExprBase).type;
    break;
  case EXPR_CAST_NULL_TO_AUTO_ARRAY:
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_04,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pEVar2 = ctx->ctx;
    pTVar11 = pEVar2->typeVoid;
    pTVar5 = pEVar2->typeTypeID;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar18;
    (memory->super_ExprBase).type = pTVar5;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
    memory->ptr = (ExprPointerLiteral *)pTVar11;
    iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x30);
    pEVar10 = (ExprMemoryLiteral *)CONCAT44(extraout_var_05,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    (pEVar10->super_ExprBase).typeID = 9;
    (pEVar10->super_ExprBase).source = pSVar18;
    (pEVar10->super_ExprBase).type = &pTVar9->super_TypeBase;
    (pEVar10->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar10->super_ExprBase).listed = false;
    (pEVar10->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
    pEVar15 = (ExprBase *)CONCAT44(extraout_var_06,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar11 = ctx->ctx->typeInt;
    pEVar15->typeID = 6;
    pEVar15->source = pSVar18;
    pEVar15->type = pTVar11;
    pEVar15->next = (ExprBase *)0x0;
    pEVar15->listed = false;
    pEVar15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
    pEVar15[1]._vptr_ExprBase = (_func_int **)0x0;
    pTVar11 = (expression->super_ExprBase).type;
    goto LAB_0014c033;
  case EXPR_CAST_NULL_TO_FUNCTION:
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x30);
    pp_Var13 = (_func_int **)CONCAT44(extraout_var_13,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeVoid);
    *(undefined4 *)(pp_Var13 + 1) = 9;
    pp_Var13[2] = (_func_int *)pSVar18;
    pp_Var13[3] = (_func_int *)pTVar9;
    pp_Var13[4] = (_func_int *)0x0;
    *(undefined1 *)(pp_Var13 + 5) = 0;
    *pp_Var13 = (_func_int *)&PTR__ExprBase_002485e0;
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x40);
    pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_14,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar11 = (expression->super_ExprBase).type;
    (pEVar14->super_ExprBase).typeID = 0xb;
    (pEVar14->super_ExprBase).source = pSVar18;
    (pEVar14->super_ExprBase).type = pTVar11;
    (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar14->super_ExprBase).listed = false;
    (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248618;
    pEVar14->ptr = (ExprPointerLiteral *)0x0;
    pEVar14[1].super_ExprBase._vptr_ExprBase = pp_Var13;
    goto LAB_0014c041;
  case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
    pTVar11 = (memory->super_ExprBase).type;
    if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID != 0x12)) {
      pTVar11 = (TypeBase *)0x0;
    }
    if (pTVar11 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4b9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pp_Var13 = pTVar11[1]._vptr_TypeBase;
    if ((pp_Var13 == (_func_int **)0x0) || (*(int *)(pp_Var13 + 1) != 0x13)) {
      pp_Var13 = (_func_int **)0x0;
    }
    if (pp_Var13 == (_func_int **)0x0) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4bd,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    if (*(int *)((long)pp_Var13 + 0x6c) != 0) {
      __assert_fail("unsigned(arrType->length) == arrType->length",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4be,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pTVar11 = (expression->super_ExprBase).type;
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
    pEVar10 = (ExprMemoryLiteral *)CONCAT44(extraout_var_01,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pTVar5 = ctx->ctx->typeInt;
    pEVar12 = (ExprPointerLiteral *)pp_Var13[0xd];
    (pEVar10->super_ExprBase).typeID = 6;
    (pEVar10->super_ExprBase).source = pSVar18;
    (pEVar10->super_ExprBase).type = pTVar5;
    (pEVar10->super_ExprBase).next = (ExprBase *)0x0;
    (pEVar10->super_ExprBase).listed = false;
    (pEVar10->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
    pEVar10->ptr = pEVar12;
    break;
  case EXPR_CAST_PTR_TO_AUTO_PTR:
    pTVar11 = (memory->super_ExprBase).type;
    if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID != 0x12)) {
      pTVar11 = (TypeBase *)0x0;
    }
    if (pTVar11 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4cc,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pp_Var13 = pTVar11[1]._vptr_TypeBase;
    if ((pp_Var13 == (_func_int **)0x0) || (*(int *)(pp_Var13 + 1) != 0x18)) {
      pp_Var13 = (_func_int **)0x0;
    }
    if ((pp_Var13 == (_func_int **)0x0) ||
       ((*(char *)(pp_Var13 + 0x22) == '\0' && (pp_Var13[0x23] == (_func_int *)0x0)))) {
      pAVar3 = ctx->ctx->allocator;
      iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
      pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_16,iVar7);
      pSVar18 = (expression->super_ExprBase).source;
      pTVar5 = ctx->ctx->typeTypeID;
      pEVar12 = (ExprPointerLiteral *)pTVar11[1]._vptr_TypeBase;
      (pEVar14->super_ExprBase).typeID = 8;
      (pEVar14->super_ExprBase).source = pSVar18;
      (pEVar14->super_ExprBase).type = pTVar5;
      (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar14->super_ExprBase).listed = false;
      (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
      pEVar14->ptr = pEVar12;
    }
    else {
      if ((memory->super_ExprBase).typeID == 9) {
        Report(ctx,"ERROR: null pointer access");
        return (ExprBase *)0x0;
      }
      if ((memory == (ExprMemoryLiteral *)0x0) || ((memory->super_ExprBase).typeID != 0xc)) {
        __assert_fail("ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x4d9,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      if ((long)memory[1].super_ExprBase._vptr_ExprBase - (long)memory->ptr < 4) {
        __assert_fail("ptr->end - ptr->ptr >= 4",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x4da,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      pAVar3 = ctx->ctx->allocator;
      iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x40);
      pEVar15 = (ExprBase *)CONCAT44(extraout_var_18,iVar7);
      pSVar18 = (expression->super_ExprBase).source;
      pTVar9 = ExpressionContext::GetReferenceType(ctx->ctx,ctx->ctx->typeTypeID);
      pEVar12 = memory->ptr;
      pEVar15->typeID = 0xc;
      pEVar15->source = pSVar18;
      pEVar15->type = &pTVar9->super_TypeBase;
      pEVar15->next = (ExprBase *)0x0;
      pEVar15->listed = false;
      pEVar15->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248428;
      pEVar15[1]._vptr_ExprBase = (_func_int **)pEVar12;
      *(undefined1 **)&pEVar15[1].typeID =
           (undefined1 *)((long)&(pEVar12->super_ExprBase)._vptr_ExprBase + 4);
      pEVar14 = (ExprMemoryLiteral *)CreateLoad(ctx,pEVar15);
    }
    pTVar11 = (expression->super_ExprBase).type;
    pEVar10 = memory;
    memory = pEVar14;
    break;
  case EXPR_CAST_AUTO_PTR_TO_PTR:
    pTVar11 = (expression->super_ExprBase).type;
    if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID != 0x12)) {
      pTVar11 = (TypeBase *)0x0;
    }
    if (pTVar11 == (TypeBase *)0x0) {
      __assert_fail("refType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x4ef,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar14 = memory;
    if ((memory->super_ExprBase).typeID != 0xd) {
      pEVar14 = (ExprMemoryLiteral *)0x0;
    }
    pEVar15 = CreateExtract(ctx,pEVar14,0,ctx->ctx->typeTypeID);
    if (pEVar15[1]._vptr_ExprBase == pTVar11[1]._vptr_TypeBase) {
      pEVar14 = (ExprMemoryLiteral *)CreateExtract(ctx,pEVar14,4,pTVar11);
      if (pEVar14 == (ExprMemoryLiteral *)0x0) {
        return (ExprBase *)0x0;
      }
      goto LAB_0014c041;
    }
    goto switchD_0014b667_default;
  case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
    pTVar11 = (memory->super_ExprBase).type;
    if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID != 0x14)) {
      pTVar11 = (TypeBase *)0x0;
    }
    if (pTVar11 == (TypeBase *)0x0) {
      __assert_fail("arrType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                    ,0x504,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
    }
    pEVar14 = memory;
    if ((memory->super_ExprBase).typeID != 0xd) {
      pEVar14 = (ExprMemoryLiteral *)0x0;
    }
    pAVar3 = ctx->ctx->allocator;
    iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
    memory = (ExprMemoryLiteral *)CONCAT44(extraout_var_00,iVar7);
    pSVar18 = (expression->super_ExprBase).source;
    pEVar2 = ctx->ctx;
    pTVar5 = pEVar2->typeTypeID;
    pEVar12 = *(ExprPointerLiteral **)&pTVar11[1].typeIndex;
    (memory->super_ExprBase).typeID = 8;
    (memory->super_ExprBase).source = pSVar18;
    (memory->super_ExprBase).type = pTVar5;
    (memory->super_ExprBase).next = (ExprBase *)0x0;
    (memory->super_ExprBase).listed = false;
    (memory->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248570;
    memory->ptr = pEVar12;
    pTVar9 = ExpressionContext::GetReferenceType(pEVar2,pEVar2->typeVoid);
    pEVar10 = (ExprMemoryLiteral *)CreateExtract(ctx,pEVar14,0,&pTVar9->super_TypeBase);
    pEVar15 = CreateExtract(ctx,pEVar14,8,ctx->ctx->typeInt);
    pTVar11 = (expression->super_ExprBase).type;
    goto LAB_0014c033;
  case EXPR_CAST_REINTERPRET:
    pTVar11 = (expression->super_ExprBase).type;
    pEVar2 = ctx->ctx;
    if ((pTVar11 == pEVar2->typeInt) && ((memory->super_ExprBase).type == pEVar2->typeTypeID)) {
      pTVar11 = (TypeBase *)memory->ptr;
      if (pTVar11 != (TypeBase *)0x0) {
        if (pTVar11->typeID == 0) {
          return (ExprBase *)0x0;
        }
        if (pTVar11 != (TypeBase *)0x0) {
          if (pTVar11->typeID == 0x1b) {
            return (ExprBase *)0x0;
          }
          if ((pTVar11 != (TypeBase *)0x0) && (pTVar11->typeID == 0x1c)) {
            return (ExprBase *)0x0;
          }
        }
      }
      uVar8 = ExpressionContext::GetTypeIndex(pEVar2,pTVar11);
      pAVar3 = ctx->ctx->allocator;
      iVar7 = (*pAVar3->_vptr_Allocator[2])(pAVar3,0x38);
      pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_21,iVar7);
      pSVar18 = (expression->super_ExprBase).source;
      pTVar11 = ctx->ctx->typeInt;
      (pEVar14->super_ExprBase).typeID = 6;
      (pEVar14->super_ExprBase).source = pSVar18;
      (pEVar14->super_ExprBase).type = pTVar11;
      (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar14->super_ExprBase).listed = false;
      (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248500;
      pEVar14->ptr = (ExprPointerLiteral *)(ulong)uVar8;
      goto LAB_0014c041;
    }
    if (pTVar11 == (TypeBase *)0x0) goto switchD_0014b667_default;
    if (((pTVar11->typeID != 0x12) ||
        (pTVar5 = (memory->super_ExprBase).type, pTVar5 == (TypeBase *)0x0)) ||
       (pTVar5->typeID != 0x12)) {
      if (pTVar11 != (TypeBase *)0x0) {
        if (((pTVar11->typeID == 0x14) &&
            (pTVar5 = (memory->super_ExprBase).type, pTVar5 != (TypeBase *)0x0)) &&
           (pTVar5->typeID == 0x14)) {
          pEVar10 = (ExprMemoryLiteral *)0x0;
          if ((memory->super_ExprBase).typeID == 0xd) {
            pEVar10 = memory;
          }
          iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
          pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_17,iVar7);
          pSVar18 = (expression->super_ExprBase).source;
          pTVar11 = (expression->super_ExprBase).type;
          pEVar12 = pEVar10->ptr;
          (pEVar14->super_ExprBase).typeID = 0xd;
          (pEVar14->super_ExprBase).source = pSVar18;
          (pEVar14->super_ExprBase).type = pTVar11;
          (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
          (pEVar14->super_ExprBase).listed = false;
          ppuVar19 = &PTR__ExprBase_00248650;
        }
        else {
          if (pTVar11 == (TypeBase *)0x0) goto switchD_0014b667_default;
          if (((pTVar11->typeID == 0x15) &&
              (pTVar5 = (memory->super_ExprBase).type, pTVar5 != (TypeBase *)0x0)) &&
             (pTVar5->typeID == 0x15)) {
            pEVar10 = (ExprMemoryLiteral *)0x0;
            if ((memory->super_ExprBase).typeID == 0xb) {
              pEVar10 = memory;
            }
            iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x40);
            pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_20,iVar7);
            pSVar18 = (expression->super_ExprBase).source;
            pTVar11 = (expression->super_ExprBase).type;
            pEVar12 = pEVar10->ptr;
            pp_Var13 = pEVar10[1].super_ExprBase._vptr_ExprBase;
            (pEVar14->super_ExprBase).typeID = 0xb;
            (pEVar14->super_ExprBase).source = pSVar18;
            (pEVar14->super_ExprBase).type = pTVar11;
            (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
            (pEVar14->super_ExprBase).listed = false;
            (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_00248618;
            pEVar14->ptr = pEVar12;
            pEVar14[1].super_ExprBase._vptr_ExprBase = pp_Var13;
            goto LAB_0014c041;
          }
          if ((pTVar11 == (TypeBase *)0x0) ||
             ((((pTVar11->typeID != 5 ||
                (pTVar5 = (memory->super_ExprBase).type, pTVar5 == (TypeBase *)0x0)) ||
               (pTVar5->typeID != 0x19)) &&
              (((pTVar11 == (TypeBase *)0x0 || (pTVar11->typeID != 0x19)) ||
               ((pTVar11 = (memory->super_ExprBase).type, pTVar11 == (TypeBase *)0x0 ||
                (pTVar11->typeID != 5)))))))) goto switchD_0014b667_default;
          pEVar10 = (ExprMemoryLiteral *)0x0;
          if ((memory->super_ExprBase).typeID == 6) {
            pEVar10 = memory;
          }
          iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x38);
          pEVar14 = (ExprMemoryLiteral *)CONCAT44(extraout_var_22,iVar7);
          pSVar18 = (expression->super_ExprBase).source;
          pTVar11 = (expression->super_ExprBase).type;
          pEVar12 = pEVar10->ptr;
          (pEVar14->super_ExprBase).typeID = 6;
          (pEVar14->super_ExprBase).source = pSVar18;
          (pEVar14->super_ExprBase).type = pTVar11;
          (pEVar14->super_ExprBase).next = (ExprBase *)0x0;
          (pEVar14->super_ExprBase).listed = false;
          ppuVar19 = &PTR__ExprBase_00248500;
        }
        (pEVar14->super_ExprBase)._vptr_ExprBase = (_func_int **)ppuVar19;
        pEVar14->ptr = pEVar12;
        goto LAB_0014c041;
      }
      goto switchD_0014b667_default;
    }
    if ((pTVar11 == (TypeBase *)0x0) || (pTVar11->typeID != 0x12)) {
      pTVar11 = (TypeBase *)0x0;
    }
    if ((memory->super_ExprBase).typeID == 9) {
      iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x30);
      pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_10,iVar7);
      pSVar18 = (expression->super_ExprBase).source;
      pTVar11 = (expression->super_ExprBase).type;
      (pEVar12->super_ExprBase).typeID = 9;
      (pEVar12->super_ExprBase).source = pSVar18;
      (pEVar12->super_ExprBase).type = pTVar11;
      (pEVar12->super_ExprBase).next = (ExprBase *)0x0;
      (pEVar12->super_ExprBase).listed = false;
      (pEVar12->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprBase_002485e0;
    }
    else {
      bVar16 = memory == (ExprMemoryLiteral *)0x0 || (memory->super_ExprBase).typeID != 0xc;
      if (bVar16) goto LAB_0014c59e;
      if ((_func_int *)((long)memory[1].super_ExprBase._vptr_ExprBase - (long)memory->ptr) <
          pTVar11[1]._vptr_TypeBase[6]) {
        __assert_fail("uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size)",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                      ,0x52d,"ExprBase *EvaluateCast(ExpressionEvalContext &, ExprTypeCast *)");
      }
      iVar7 = (*pEVar2->allocator->_vptr_Allocator[2])(pEVar2->allocator,0x40);
      pEVar12 = (ExprPointerLiteral *)CONCAT44(extraout_var_27,iVar7);
      ExprPointerLiteral::ExprPointerLiteral
                (pEVar12,(expression->super_ExprBase).source,(expression->super_ExprBase).type,
                 (uchar *)memory->ptr,(uchar *)memory[1].super_ExprBase._vptr_ExprBase);
    }
LAB_0014c594:
    unaff_R12 = CheckType(&expression->super_ExprBase,&pEVar12->super_ExprBase);
    bVar16 = false;
LAB_0014c59e:
    if (!bVar16) {
      return unaff_R12;
    }
switchD_0014b667_default:
    pTVar11 = (memory->super_ExprBase).type;
    pcVar4 = (pTVar11->name).begin;
    pTVar5 = (expression->super_ExprBase).type;
    Report(ctx,"ERROR: failed to cast \'%.*s\' to \'%.*s\'",
           (ulong)(uint)(*(int *)&(pTVar11->name).end - (int)pcVar4),pcVar4,
           (ulong)(uint)(*(int *)&(pTVar5->name).end - (int)(pTVar5->name).begin));
    return (ExprBase *)0x0;
  default:
    goto switchD_0014b667_default;
  }
  pEVar15 = (ExprBase *)0x0;
LAB_0014c033:
  pEVar14 = CreateConstruct(ctx,pTVar11,&memory->super_ExprBase,&pEVar10->super_ExprBase,pEVar15);
  if (pEVar14 == (ExprMemoryLiteral *)0x0) {
    return (ExprBase *)0x0;
  }
LAB_0014c041:
  pEVar15 = CheckType(&expression->super_ExprBase,&pEVar14->super_ExprBase);
  return pEVar15;
}

Assistant:

ExprBase* EvaluateCast(ExpressionEvalContext &ctx, ExprTypeCast *expression)
{
	if(!AddInstruction(ctx))
		return NULL;

	ExprBase *value = Evaluate(ctx, expression->value);

	if(!value)
		return NULL;

	switch(expression->category)
	{
	case EXPR_CAST_NUMERICAL:
		if(ctx.ctx.IsIntegerType(expression->type))
		{
			long long result = 0;

			if(ExprRationalLiteral *expr = getType<ExprRationalLiteral>(value))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, expr->value != 0.0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)expr->value));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)expr->value));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)expr->value));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, (long long)expr->value));
			}
			else if(TryTakeLong(value, result))
			{
				if(expression->type == ctx.ctx.typeBool)
					return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, result != 0));

				if(expression->type == ctx.ctx.typeChar)
					return CheckType(expression, new (ctx.ctx.get<ExprCharacterLiteral>()) ExprCharacterLiteral(expression->source, ctx.ctx.typeChar, (char)result));

				if(expression->type == ctx.ctx.typeShort)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeShort, (short)result));

				if(expression->type == ctx.ctx.typeInt)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, (int)result));

				if(expression->type == ctx.ctx.typeLong)
					return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeLong, result));
			}
		}
		else if(ctx.ctx.IsFloatingPointType(expression->type))
		{
			double result = 0.0;

			if(TryTakeDouble(value, result))
			{
				if(expression->type == ctx.ctx.typeFloat)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeFloat, (float)result));

				if(expression->type == ctx.ctx.typeDouble)
					return CheckType(expression, new (ctx.ctx.get<ExprRationalLiteral>()) ExprRationalLiteral(expression->source, ctx.ctx.typeDouble, result));
			}
		}
		break;
	case EXPR_CAST_PTR_TO_BOOL:
		return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(value)));
	case EXPR_CAST_UNSIZED_TO_BOOL:
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, !isType<ExprNullptrLiteral>(ptr)));
		}
		break;
	case EXPR_CAST_FUNCTION_TO_BOOL:
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprBoolLiteral>()) ExprBoolLiteral(expression->source, ctx.ctx.typeBool, funcLiteral->data != NULL));
		}
		break;
	case EXPR_CAST_NULL_TO_PTR:
		return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
	case EXPR_CAST_NULL_TO_AUTO_PTR:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_UNSIZED:
		{
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *size = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, ptr, size, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_AUTO_ARRAY:
		{
			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, ctx.ctx.typeVoid);
			ExprBase *ptr = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, 0);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_NULL_TO_FUNCTION:
		{
			ExprBase *context = new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));

			ExprFunctionLiteral *result = new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, NULL, context);

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_ARRAY_PTR_TO_UNSIZED:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeArray *arrType = getType<TypeArray>(refType->subType);

			assert(arrType);
			assert(unsigned(arrType->length) == arrType->length);

			ExprBase *result = CreateConstruct(ctx, expression->type, value, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, arrType->length), NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_PTR_TO_AUTO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(value->type);

			assert(refType);

			TypeClass *classType = getType<TypeClass>(refType->subType);

			ExprBase *typeId = NULL;

			if(classType && (classType->extendable || classType->baseClass))
			{
				if(isType<ExprNullptrLiteral>(value))
					return Report(ctx, "ERROR: null pointer access");

				ExprPointerLiteral *ptr = getType<ExprPointerLiteral>(value);

				assert(ptr);
				assert(ptr->end - ptr->ptr >= 4);

				typeId = CreateLoad(ctx, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, ctx.ctx.GetReferenceType(ctx.ctx.typeTypeID), ptr->ptr, ptr->ptr + 4));
			}
			else
			{
				typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, refType->subType);
			}

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, value, NULL);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_AUTO_PTR_TO_PTR:
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			assert(refType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprTypeLiteral *typeId = getType<ExprTypeLiteral>(CreateExtract(ctx, memLiteral, 0, ctx.ctx.typeTypeID));

			if(typeId->value != refType->subType)
				return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));

			ExprBase *ptr = CreateExtract(ctx, memLiteral, 4, refType);

			if(!ptr)
				return NULL;

			return CheckType(expression, ptr);
		}
		break;
	case EXPR_CAST_UNSIZED_TO_AUTO_ARRAY:
		{
			TypeUnsizedArray *arrType = getType<TypeUnsizedArray>(value->type);

			assert(arrType);

			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			ExprBase *typeId = new (ctx.ctx.get<ExprTypeLiteral>()) ExprTypeLiteral(expression->source, ctx.ctx.typeTypeID, arrType->subType);
			ExprBase *ptr = CreateExtract(ctx, memLiteral, 0, ctx.ctx.GetReferenceType(ctx.ctx.typeVoid));
			ExprBase *length = CreateExtract(ctx, memLiteral, sizeof(void*), ctx.ctx.typeInt);

			ExprBase *result = CreateConstruct(ctx, expression->type, typeId, ptr, length);

			if(!result)
				return NULL;

			return CheckType(expression, result);
		}
		break;
	case EXPR_CAST_REINTERPRET:
		if(expression->type == ctx.ctx.typeInt && value->type == ctx.ctx.typeTypeID)
		{
			ExprTypeLiteral *typeLiteral = getType<ExprTypeLiteral>(value);

			if(isType<TypeError>(typeLiteral->value))
				return NULL;

			if(isType<TypeArgumentSet>(typeLiteral->value) || isType<TypeMemberSet>(typeLiteral->value))
				return NULL;

			unsigned index = ctx.ctx.GetTypeIndex(typeLiteral->value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, ctx.ctx.typeInt, index));
		}
		else if(isType<TypeRef>(expression->type) && isType<TypeRef>(value->type))
		{
			TypeRef *refType = getType<TypeRef>(expression->type);

			if(isType<ExprNullptrLiteral>(value))
				return CheckType(expression, new (ctx.ctx.get<ExprNullptrLiteral>()) ExprNullptrLiteral(expression->source, expression->type));
			
			if(ExprPointerLiteral *tmp = getType<ExprPointerLiteral>(value))
			{
				(void)refType;
				assert(uintptr_t(tmp->end - tmp->ptr) >= uintptr_t(refType->subType->size));

				return CheckType(expression, new (ctx.ctx.get<ExprPointerLiteral>()) ExprPointerLiteral(expression->source, expression->type, tmp->ptr, tmp->end));
			}
		}
		else if(isType<TypeUnsizedArray>(expression->type) && isType<TypeUnsizedArray>(value->type))
		{
			ExprMemoryLiteral *memLiteral = getType<ExprMemoryLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprMemoryLiteral>()) ExprMemoryLiteral(expression->source, expression->type, memLiteral->ptr));
		}
		else if(isType<TypeFunction>(expression->type) && isType<TypeFunction>(value->type))
		{
			ExprFunctionLiteral *funcLiteral = getType<ExprFunctionLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprFunctionLiteral>()) ExprFunctionLiteral(expression->source, expression->type, funcLiteral->data, funcLiteral->context));
		}
		else if(isType<TypeInt>(expression->type) && isType<TypeEnum>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		else if(isType<TypeEnum>(expression->type) && isType<TypeInt>(value->type))
		{
			ExprIntegerLiteral *intLiteral = getType<ExprIntegerLiteral>(value);

			return CheckType(expression, new (ctx.ctx.get<ExprIntegerLiteral>()) ExprIntegerLiteral(expression->source, expression->type, intLiteral->value));
		}
		break;
	}

	return Report(ctx, "ERROR: failed to cast '%.*s' to '%.*s'", FMT_ISTR(value->type->name), FMT_ISTR(expression->type->name));
}